

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Spline.H
# Opt level: O0

void __thiscall
amrex::EB2::SplineIF::addLineElement
          (SplineIF *this,vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *this_00;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_RSI;
  LineDistFcnElement2d *theLine;
  value_type *in_stack_ffffffffffffff88;
  LineDistFcnElement2d *in_stack_ffffffffffffff90;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_stack_ffffffffffffffb8;
  LineDistFcnElement2d *in_stack_ffffffffffffffc0;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_stack_ffffffffffffffd8;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_stack_ffffffffffffffe0;
  
  this_00 = (vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *)
            operator_new(0x38);
  LineDistFcnElement2d::LineDistFcnElement2d(in_stack_ffffffffffffff90);
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  LineDistFcnElement2d::set_control_points(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::~vector(in_RSI);
  std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>::push_back
            (this_00,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void addLineElement(std::vector<amrex::RealVect> pts) {
    LineDistFcnElement2d * theLine = new LineDistFcnElement2d();
    theLine->set_control_points(pts);
    geomElements.push_back(theLine);
  }